

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionController_SetAssetReissuanceTest1_Test::TestBody
          (ConfidentialTransactionController_SetAssetReissuanceTest1_Test *this)

{
  bool bVar1;
  __type _Var2;
  undefined1 extraout_DL;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  char *in_stack_fffffffffffffa98;
  _Alloc_hider in_stack_fffffffffffffaa0;
  pointer in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  AssertionResult gtest_ar;
  IssuanceParameter local_510;
  undefined1 local_4a0 [16];
  Txid txid;
  IssuanceParameter param;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_400;
  ConfidentialTransactionController tx;
  BlindFactor entropy;
  BlindFactor blind_factor;
  ConfidentialTransactionController expect_tx;
  ConfidentialTransactionController tx_base;
  ElementsConfidentialAddress address;
  IssuanceParameter local_108;
  IssuanceParameter local_98;
  
  std::__cxx11::string::string
            ((string *)&address,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,(allocator *)&param);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&tx_base,(string *)&address);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
             ,(allocator *)&param);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&expect_tx,(string *)&address);
  std::__cxx11::string::~string((string *)&address);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&tx,&tx_base);
  std::__cxx11::string::string
            ((string *)&address,"8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e",
             (allocator *)&param);
  cfd::core::Txid::Txid(&txid,(string *)&address);
  std::__cxx11::string::~string((string *)&address);
  local_4a0._0_8_ = cfd::core::Amount::CreateByCoinAmount(7.0);
  local_4a0[8] = extraout_DL;
  std::__cxx11::string::string
            ((string *)&param,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             (allocator *)&local_510);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&address,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",
             (allocator *)&local_510);
  cfd::core::BlindFactor::BlindFactor(&blind_factor,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
             (allocator *)&local_510);
  cfd::core::BlindFactor::BlindFactor(&entropy,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  bVar1 = testing::internal::AlwaysTrue();
  bVar4 = SUB81(&blind_factor,0);
  bVar5 = SUB81(&entropy,0);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::GetLockingScript();
      cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
      cfd::core::Pubkey::GetData();
      cfd::ConfidentialTransactionController::SetAssetReissuance
                ((Txid *)&local_510,(uint)&tx,(Amount *)&txid,(Script *)0x2,(ByteData *)local_4a0,
                 (BlindFactor *)&stack0xfffffffffffffaa0,(BlindFactor *)&gtest_ar,bVar4,bVar5);
      cfd::core::IssuanceParameter::operator=(&param,&local_510);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_510);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_400);
      cfd::core::Script::~Script((Script *)&stack0xfffffffffffffaa0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffaa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x83,
               "Expected: (param = tx.SetAssetReissuance(txid, 2, amount, address.GetLockingScript(), address.GetConfidentialKey().GetData(), blind_factor, entropy, false, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffaa0,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaa0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_510);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",
             (char *)local_510.entropy._vptr_BlindFactor,in_stack_fffffffffffffaa0._M_p);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa0);
  std::__cxx11::string::~string((string *)&local_510);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_510);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffaa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffaa0,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaa0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_510);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionController::operator=(&tx,&tx_base);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::GetLockingScript();
      cfd::core::ByteData::ByteData((ByteData *)&stack0xfffffffffffffaa0);
      cfd::ConfidentialTransactionController::SetAssetReissuance
                ((Txid *)&local_98,(uint)&tx,(Amount *)&txid,(Script *)0x2,(ByteData *)local_4a0,
                 &local_510.entropy,(BlindFactor *)&stack0xfffffffffffffaa0,bVar4,bVar5);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_98);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &stack0xfffffffffffffaa0);
      cfd::core::Script::~Script((Script *)&local_510);
    }
  }
  else {
    testing::Message::Message((Message *)&local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffaa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x8c,
               "Expected: (tx.SetAssetReissuance(txid, 2, amount, address.GetLockingScript(), ByteData(), blind_factor, entropy, true, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffaa0,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaa0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_510);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_510,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xfffffffffffffaa0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa0);
  std::__cxx11::string::~string((string *)&local_510);
  if (_Var2) {
    cfd::ConfidentialTransactionController::operator=(&tx,&tx_base);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ElementsConfidentialAddress::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)&stack0xfffffffffffffaa0);
        cfd::ConfidentialTransactionController::SetAssetReissuance
                  ((Txid *)&local_108,(uint)&tx,(Amount *)&txid,(Script *)0x2,(ByteData *)local_4a0,
                   &local_510.entropy,(BlindFactor *)&stack0xfffffffffffffaa0,bVar4,bVar5);
        cfd::core::IssuanceParameter::~IssuanceParameter(&local_108);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &stack0xfffffffffffffaa0);
        cfd::core::Script::~Script((Script *)&local_510);
      }
    }
    else {
      testing::Message::Message((Message *)&local_510);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffaa0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
                 ,0x93,
                 "Expected: (tx.SetAssetReissuance(txid, 2, amount, address.GetLockingScript(), ByteData(), blind_factor, entropy, true, false)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffaa0,(Message *)&local_510);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaa0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_510);
    }
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTRNE
            ((char *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8,
             in_stack_fffffffffffffaa0._M_p,in_stack_fffffffffffffa98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa0);
  std::__cxx11::string::~string((string *)&local_510);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_510);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffaa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffaa0,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaa0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_510);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  cfd::core::BlindFactor::~BlindFactor(&entropy);
  cfd::core::BlindFactor::~BlindFactor(&blind_factor);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&address);
  cfd::core::Txid::~Txid(&txid);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&tx);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&expect_tx);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, SetAssetReissuanceTest1)
{
    ConfidentialTransactionController tx_base(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
    ConfidentialTransactionController expect_tx(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");

    // not blind
    ConfidentialTransactionController tx(tx_base);
    Txid txid("8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e");
    Amount amount = Amount::CreateByCoinAmount(7.0);
    ElementsConfidentialAddress address("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
    BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
    BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");

    IssuanceParameter param;
    EXPECT_NO_THROW(
        (param = tx.SetAssetReissuance(txid, 2, amount,
                                       address.GetLockingScript(),
                                       address.GetConfidentialKey().GetData(), blind_factor,
                                       entropy, false, false)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());

    // txout randomize
    tx = tx_base;
    EXPECT_NO_THROW(
        (tx.SetAssetReissuance(txid, 2, amount,
                               address.GetLockingScript(),
                               ByteData(), blind_factor,
                               entropy, true, false)));
    if (tx.GetHex() == expect_tx.GetHex()) {
      tx = tx_base;
      EXPECT_NO_THROW(
          (tx.SetAssetReissuance(txid, 2, amount,
                                 address.GetLockingScript(),
                                 ByteData(), blind_factor,
                                 entropy, true, false)));
    }
    EXPECT_STRNE(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}